

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallHeapBlockAllocator.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
SetExplicitFreeList(SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
                    *this,FreeObject *list)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (list == (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,199,"(list != nullptr)","list != nullptr");
    if (!bVar2) goto LAB_00743ead;
    *puVar3 = 0;
  }
  if (this->heapBlock != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,200,"(this->heapBlock == nullptr)","this->heapBlock == nullptr");
    if (!bVar2) goto LAB_00743ead;
    *puVar3 = 0;
  }
  if (this->freeObjectList != (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0xc9,"(this->freeObjectList == nullptr)","this->freeObjectList == nullptr");
    if (!bVar2) {
LAB_00743ead:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this->freeObjectList = list;
  return;
}

Assistant:

void
SmallHeapBlockAllocator<TBlockType>::SetExplicitFreeList(FreeObject* list)
{
    Assert(list != nullptr);
    Assert(this->heapBlock == nullptr);
    Assert(this->freeObjectList == nullptr);

    this->freeObjectList = list;
}